

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O2

void __thiscall BackwardPass::RemoveEmptyLoops(BackwardPass *this)

{
  Loop *pLVar1;
  AllocatorType *allocator;
  bool bVar2;
  uint sourceContextId;
  uint functionId;
  anon_struct_72_6_1d3a94bb *obj;
  Loop *loop;
  
  sourceContextId = Func::GetSourceContextId(this->func);
  functionId = Func::GetLocalFunctionId(this->func);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,MemOpPhase,sourceContextId,functionId);
  if (!bVar2) {
    pLVar1 = this->func->m_fg->loopList;
    while (loop = pLVar1, loop != (Loop *)0x0) {
      pLVar1 = loop->next;
      bVar2 = IsEmptyLoopAfterMemOp(this,loop);
      if (bVar2) {
        RestoreInductionVariableValuesAfterMemOp(this,loop);
        RemoveEmptyLoopAfterMemOp(this,loop);
      }
      obj = (anon_struct_72_6_1d3a94bb *)loop->memOpInfo;
      if (obj != (anon_struct_72_6_1d3a94bb *)0x0) {
        allocator = this->func->topFunc->m_fg->alloc;
        if (&obj->candidates->super_SList<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount>
            != (SList<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
          SList<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount>::Clear
                    (&obj->candidates->
                      super_SList<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount>);
          Memory::
          DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,SListCounted<Loop::MemOpCandidate*,Memory::ArenaAllocator>>
                    (allocator,loop->memOpInfo->candidates);
          obj = (anon_struct_72_6_1d3a94bb *)loop->memOpInfo;
        }
        if (obj->inductionVariableChangeInfoMap !=
            (BaseDictionary<unsigned_int,_Loop::InductionVariableChangeInfo,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
             *)0x0) {
          JsUtil::
          BaseDictionary<unsigned_int,_Loop::InductionVariableChangeInfo,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::Clear(obj->inductionVariableChangeInfoMap);
          Memory::
          DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,JsUtil::BaseDictionary<unsigned_int,Loop::InductionVariableChangeInfo,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>>
                    (allocator,loop->memOpInfo->inductionVariableChangeInfoMap);
          obj = (anon_struct_72_6_1d3a94bb *)loop->memOpInfo;
        }
        if (obj->inductionVariableOpndPerUnrollMap !=
            (BaseDictionary<unsigned_char,_IR::Opnd_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
             *)0x0) {
          JsUtil::
          BaseDictionary<unsigned_char,_IR::Opnd_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::Clear(obj->inductionVariableOpndPerUnrollMap);
          Memory::
          DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,JsUtil::BaseDictionary<unsigned_char,IR::Opnd*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>>
                    (allocator,loop->memOpInfo->inductionVariableOpndPerUnrollMap);
          obj = (anon_struct_72_6_1d3a94bb *)loop->memOpInfo;
        }
        if (obj->inductionVariablesUsedAfterLoop != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
          Memory::
          DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
                    (this->tempAlloc,obj->inductionVariablesUsedAfterLoop);
          obj = (anon_struct_72_6_1d3a94bb *)loop->memOpInfo;
        }
        Memory::
        DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,Loop::MemOpInfo>
                  (allocator,obj);
      }
    }
  }
  return;
}

Assistant:

void
BackwardPass::RemoveEmptyLoops()
{
    if (PHASE_OFF(Js::MemOpPhase, this->func))
    {
        return;

    }
    const auto DeleteMemOpInfo = [&](Loop *loop)
    {
        JitArenaAllocator *alloc = this->func->GetTopFunc()->m_fg->alloc;

        if (!loop->memOpInfo)
        {
            return;
        }

        if (loop->memOpInfo->candidates)
        {
            loop->memOpInfo->candidates->Clear();
            JitAdelete(alloc, loop->memOpInfo->candidates);
        }

        if (loop->memOpInfo->inductionVariableChangeInfoMap)
        {
            loop->memOpInfo->inductionVariableChangeInfoMap->Clear();
            JitAdelete(alloc, loop->memOpInfo->inductionVariableChangeInfoMap);
        }

        if (loop->memOpInfo->inductionVariableOpndPerUnrollMap)
        {
            loop->memOpInfo->inductionVariableOpndPerUnrollMap->Clear();
            JitAdelete(alloc, loop->memOpInfo->inductionVariableOpndPerUnrollMap);
        }

        if (loop->memOpInfo->inductionVariablesUsedAfterLoop)
        {
            JitAdelete(this->tempAlloc, loop->memOpInfo->inductionVariablesUsedAfterLoop);
        }
        JitAdelete(alloc, loop->memOpInfo);
    };

    FOREACH_LOOP_IN_FUNC_EDITING(loop, this->func)
    {
        if (IsEmptyLoopAfterMemOp(loop))
        {
            RestoreInductionVariableValuesAfterMemOp(loop);
            RemoveEmptyLoopAfterMemOp(loop);
        }
        // Remove memop info as we don't need them after this point.
        DeleteMemOpInfo(loop);

    } NEXT_LOOP_IN_FUNC_EDITING;

}